

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgstrf.c
# Opt level: O2

void sgstrf(superlu_options_t *options,SuperMatrix *A,int relax,int panel_size,int *etree,void *work
           ,int_t lwork,int *perm_c,int *perm_r,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,
           SuperLUStat_t *stat,int_t *info)

{
  int iVar1;
  int_t *piVar2;
  int_t *piVar3;
  int iVar4;
  int_t iVar5;
  int_t iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int_t *piVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  int nseg;
  uint local_184;
  ulong local_180;
  int *local_178;
  int *repfnz;
  int *segrep;
  fact_t local_15c;
  uint local_158;
  int nseg1;
  int_t *xprune;
  ulong local_148;
  superlu_options_t *local_140;
  int *local_138;
  int *local_130;
  float *dense;
  int *marker;
  int_t nnzU;
  int_t nnzL;
  int usepr;
  int pivrow;
  int_t nzlumax;
  ulong local_100;
  ulong local_f8;
  int_t *local_f0;
  float *tempv;
  int_t *xplore;
  int_t *local_d8;
  long local_d0;
  int_t *local_c8;
  int_t *local_c0;
  int *local_b8;
  int *local_b0;
  SuperMatrix *local_a8;
  int *local_a0;
  int_t *local_98;
  int_t *local_90;
  double local_88;
  int *panel_lsub;
  int *parent;
  float *swork;
  int *iwork;
  long local_60;
  int_t *local_58;
  flops_t *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_180 = CONCAT44(local_180._4_4_,relax);
  local_178 = etree;
  iVar4 = sp_ienv(6);
  local_15c = options->Fact;
  local_88 = options->DiagPivotThresh;
  local_a0 = stat->panel_histo;
  local_50 = stat->ops;
  uVar7 = A->nrow;
  local_148 = (ulong)uVar7;
  local_184 = A->ncol;
  local_158 = local_184;
  if ((int)uVar7 < (int)local_184) {
    local_158 = uVar7;
  }
  piVar10 = (int_t *)A->Store;
  lVar12 = *(long *)(piVar10 + 2);
  piVar2 = *(int_t **)(piVar10 + 4);
  local_90 = *(int_t **)(piVar10 + 6);
  local_98 = *(int_t **)(piVar10 + 8);
  local_100 = (ulong)(uint)panel_size;
  local_a8 = A;
  iVar5 = sLUMemInit(local_15c,work,lwork,uVar7,local_184,*piVar10,panel_size,(float)iVar4,L,U,Glu,
                     &iwork,&swork);
  uVar15 = local_148;
  *info = iVar5;
  if (iVar5 == 0) {
    local_b0 = Glu->xsup;
    local_b8 = Glu->supno;
    local_c0 = Glu->xlsub;
    local_c8 = Glu->xlusup;
    local_f0 = Glu->xusub;
    iVar4 = (int)local_148;
    iVar13 = (int)local_100;
    local_140 = options;
    SetIWork(iVar4,local_184,iVar13,iwork,&segrep,&parent,&xplore,&repfnz,&panel_lsub,&xprune,
             &marker);
    sSetRWork(iVar4,iVar13,swork,&dense,&tempv);
    uVar17 = 0;
    usepr = (int)(local_15c == SamePattern_SameRowPerm);
    if (local_15c == SamePattern_SameRowPerm) {
      local_130 = int32Malloc(iVar4);
      uVar9 = 0;
      if (0 < iVar4) {
        uVar9 = uVar15 & 0xffffffff;
      }
      for (uVar14 = 0; uVar9 != uVar14; uVar14 = uVar14 + 1) {
        local_130[perm_r[uVar14]] = (int)uVar14;
      }
    }
    else {
      local_130 = (int *)0x0;
    }
    uVar7 = local_184;
    local_d0 = (long)iVar4;
    local_60 = (long)(int)local_184;
    local_138 = int32Malloc(local_184);
    uVar9 = 0;
    if (0 < (int)uVar7) {
      uVar9 = (ulong)uVar7;
    }
    for (; uVar9 != uVar17; uVar17 = uVar17 + 1) {
      local_138[perm_c[uVar17]] = (int)uVar17;
    }
    piVar10 = intMalloc(uVar7);
    if (local_140->SymmetricMode == YES) {
      heap_relax_snode(uVar7,local_178,(int)local_180,marker,piVar10);
    }
    else {
      relax_snode(uVar7,local_178,(int)local_180,marker,piVar10);
    }
    ifill(perm_r,iVar4,-1);
    ifill(marker,iVar4 * 3,-1);
    *local_b8 = -1;
    *local_c8 = 0;
    *local_f0 = 0;
    *local_c0 = 0;
    *local_b0 = 0;
    local_58 = piVar10 + 1;
    local_48 = local_d0 * 4;
    local_180 = 0;
    uVar17 = 0;
    local_d8 = piVar10;
    while( true ) {
      piVar10 = local_d8;
      uVar7 = local_158;
      iVar13 = (int)uVar17;
      iVar4 = (int)uVar15;
      if ((int)local_158 <= iVar13) break;
      local_178 = (int *)(uVar17 & 0xffffffff);
      uVar9 = (ulong)iVar13;
      iVar16 = local_d8[uVar9];
      if ((superlu_options_t *)(long)iVar16 == (superlu_options_t *)0xffffffffffffffff) {
        uVar7 = (int)local_100 + iVar13;
        if ((int)local_158 <= (int)uVar7) {
          uVar7 = local_158;
        }
        uVar15 = 0;
        do {
          if ((long)(int)uVar7 <= (long)(uVar9 + 1 + uVar15)) {
            uVar7 = (int)uVar15 + iVar13 + 1;
            uVar17 = local_100;
            goto LAB_0010cbfc;
          }
          uVar17 = uVar15 + 1;
          lVar11 = uVar9 + uVar15;
          uVar15 = uVar17;
        } while (local_58[lVar11] == -1);
        uVar7 = iVar13 + (int)uVar17;
LAB_0010cbfc:
        iVar16 = local_158 - iVar13;
        if (uVar7 != local_158) {
          iVar16 = (int)uVar17;
        }
        local_a0[iVar16] = local_a0[iVar16] + 1;
        spanel_dfs(iVar4,iVar16,iVar13,local_a8,perm_r,&nseg1,dense,panel_lsub,segrep,repfnz,xprune,
                   marker,parent,xplore,Glu);
        spanel_bmod((int)local_148,iVar16,(int)local_178,nseg1,dense,tempv,segrep,repfnz,Glu,stat);
        local_f8 = (ulong)(uint)(iVar16 + (int)local_178);
        local_140 = (superlu_options_t *)(long)(iVar16 + (int)local_178);
        lVar11 = 0;
        for (; uVar15 = local_148, uVar17 = local_f8, (long)uVar9 < (long)local_140;
            uVar9 = uVar9 + 1) {
          nseg = nseg1;
          iVar13 = (int)uVar9;
          iVar4 = scolumn_dfs((int)local_148,iVar13,perm_r,&nseg,(int *)((long)panel_lsub + lVar11),
                              segrep,(int *)((long)repfnz + lVar11),xprune,marker,parent,xplore,Glu)
          ;
          *info = iVar4;
          if (iVar4 != 0) {
            return;
          }
          iVar4 = scolumn_bmod(iVar13,nseg - nseg1,(float *)((long)dense + lVar11),tempv,
                               segrep + nseg1,(int *)((long)repfnz + lVar11),(int)local_178,Glu,stat
                              );
          *info = iVar4;
          if (iVar4 != 0) {
            return;
          }
          iVar4 = scopy_to_ucol(iVar13,nseg,segrep,(int *)((long)repfnz + lVar11),perm_r,
                                (float *)((long)dense + lVar11),Glu);
          *info = iVar4;
          if (iVar4 != 0) {
            return;
          }
          uVar8 = spivotL(iVar13,local_88,&usepr,perm_r,local_130,local_138,&pivrow,Glu,stat);
          *info = uVar8;
          uVar7 = (uint)local_180;
          if ((uint)local_180 == 0) {
            uVar7 = uVar8;
          }
          local_180 = local_180 & 0xffffffff;
          if (uVar8 != 0) {
            local_180 = (ulong)uVar7;
          }
          spruneL(iVar13,perm_r,pivrow,nseg,segrep,(int *)((long)repfnz + lVar11),xprune,Glu);
          resetrep_col(nseg,segrep,(int *)((long)repfnz + lVar11));
          lVar11 = lVar11 + local_48;
        }
      }
      else {
        local_a0[(long)(iVar16 - iVar13) + 1] = local_a0[(long)(iVar16 - iVar13) + 1] + 1;
        local_140 = (superlu_options_t *)(long)iVar16;
        iVar5 = ssnode_dfs(iVar13,iVar16,piVar2,local_90,local_98,xprune,marker,Glu);
        *info = iVar5;
        if (iVar5 != 0) {
          return;
        }
        local_f8 = CONCAT44(local_f8._4_4_,local_f0[uVar9]);
        iVar5 = local_c8[uVar9];
        local_38 = (long)local_b8[uVar9];
        local_40 = (long)local_b0[local_38];
        iVar4 = local_c0[local_40 + 1];
        iVar1 = local_c0[local_40];
        nzlumax = Glu->nzlumax;
        while (uVar17 = uVar9, nzlumax < (iVar4 - iVar1) * ((iVar16 - iVar13) + 1) + iVar5) {
          iVar6 = sLUMemXpand((int)local_178,iVar5,LUSUP,&nzlumax,Glu);
          *info = iVar6;
          if (iVar6 != 0) {
            return;
          }
        }
        while (uVar15 = local_148, (long)uVar17 <= (long)local_140) {
          uVar15 = uVar17 + 1;
          local_f0[uVar17 + 1] = (int_t)local_f8;
          iVar4 = local_98[uVar17];
          for (lVar11 = (long)local_90[uVar17]; lVar11 < iVar4; lVar11 = lVar11 + 1) {
            dense[piVar2[lVar11]] = *(float *)(lVar12 + lVar11 * 4);
          }
          ssnode_bmod((int)uVar17,(int)local_38,(int)local_40,dense,tempv,Glu,stat);
          uVar8 = spivotL((int)uVar17,local_88,&usepr,perm_r,local_130,local_138,&pivrow,Glu,stat);
          *info = uVar8;
          uVar7 = (uint)local_180;
          if ((uint)local_180 == 0) {
            uVar7 = uVar8;
          }
          local_180 = local_180 & 0xffffffff;
          uVar17 = uVar15;
          if (uVar8 != 0) {
            local_180 = (ulong)uVar7;
          }
        }
      }
    }
    iVar13 = (int)local_180;
    *info = iVar13;
    uVar8 = iVar13 - 1;
    if (iVar13 == 0) {
      uVar8 = local_184;
    }
    if ((int)uVar8 < iVar4) {
      lVar12 = 0;
      while ((lVar12 < local_d0 && ((int)uVar8 < iVar4))) {
        if (perm_r[lVar12] == -1) {
          perm_r[lVar12] = uVar8;
          uVar8 = uVar8 + 1;
        }
        lVar12 = lVar12 + 1;
      }
    }
    countnz(local_158,xprune,&nnzL,&nnzU,Glu);
    fixupL(uVar7,perm_r,Glu);
    sLUWorkFree(iwork,swork,Glu);
    superlu_free(xplore);
    superlu_free(xprune);
    if (local_15c == SamePattern_SameRowPerm) {
      piVar2 = (int_t *)L->Store;
      *piVar2 = nnzL;
      piVar2[1] = Glu->supno[local_60];
      piVar3 = Glu->xlusup;
      *(void **)(piVar2 + 2) = Glu->lusup;
      *(int_t **)(piVar2 + 4) = piVar3;
      piVar3 = Glu->xlsub;
      *(int_t **)(piVar2 + 6) = Glu->lsub;
      *(int_t **)(piVar2 + 8) = piVar3;
      piVar2 = (int_t *)U->Store;
      *piVar2 = nnzU;
      piVar3 = Glu->usub;
      *(void **)(piVar2 + 2) = Glu->ucol;
      *(int_t **)(piVar2 + 4) = piVar3;
      *(int_t **)(piVar2 + 6) = Glu->xusub;
    }
    else {
      sCreate_SuperNode_Matrix
                (L,local_a8->nrow,uVar7,nnzL,(float *)Glu->lusup,Glu->xlusup,Glu->lsub,Glu->xlsub,
                 Glu->supno,Glu->xsup,SLU_SC,SLU_S,SLU_TRLU);
      sCreate_CompCol_Matrix
                (U,uVar7,uVar7,nnzU,(float *)Glu->ucol,Glu->usub,Glu->xusub,SLU_NC,SLU_S,SLU_TRU);
    }
    local_50[7] = local_50[0x13] + local_50[0x14] + local_50[7];
    iVar4 = Glu->num_expansions + -1;
    Glu->num_expansions = iVar4;
    stat->expansions = iVar4;
    if (local_15c == SamePattern_SameRowPerm) {
      superlu_free(local_130);
    }
    superlu_free(local_138);
    superlu_free(piVar10);
  }
  return;
}

Assistant:

void
sgstrf (superlu_options_t *options, SuperMatrix *A,
        int relax, int panel_size, int *etree, void *work, int_t lwork,
        int *perm_c, int *perm_r, SuperMatrix *L, SuperMatrix *U,
    	GlobalLU_t *Glu, /* persistent to facilitate multiple factorizations */
        SuperLUStat_t *stat, int_t *info)
{
    /* Local working arrays */
    NCPformat *Astore;
    int       *iperm_r = NULL; /* inverse of perm_r; used when 
                                  options->Fact == SamePattern_SameRowPerm */
    int       *iperm_c; /* inverse of perm_c */
    int       *iwork;
    float    *swork;
    int	      *segrep, *repfnz, *parent;
    int	      *panel_lsub; /* dense[]/panel_lsub[] pair forms a w-wide SPA */
    int_t     *xprune, *xplore;
    int	      *marker;
    float    *dense, *tempv;
    int       *relax_end;
    float    *a;
    int_t     *asub, *xa_begin, *xa_end;
    int_t     *xlsub, *xlusup, *xusub;
    int       *xsup, *supno;
    int_t     nzlumax;
    float fill_ratio = sp_ienv(6);  /* estimated fill ratio */

    /* Local scalars */
    fact_t    fact = options->Fact;
    double    diag_pivot_thresh = options->DiagPivotThresh;
    int       pivrow;   /* pivotal row number in the original matrix A */
    int       nseg1;	/* no of segments in U-column above panel row jcol */
    int       nseg;	/* no of segments in each U-column */
    register int jcol, jj;
    register int kcol;	/* end column of a relaxed snode */
    register int icol;
    int_t     i, k, iinfo, new_next, nextlu, nextu;
    int       m, n, min_mn, jsupno, fsupc;
    int       w_def;	/* upper bound on panel width */
    int       usepr, iperm_r_allocated = 0;
    int_t     nnzL, nnzU;
    int       *panel_histo = stat->panel_histo;
    flops_t   *ops = stat->ops;

    iinfo    = 0;
    m        = A->nrow;
    n        = A->ncol;
    min_mn   = SUPERLU_MIN(m, n);
    Astore   = A->Store;
    a        = Astore->nzval;
    asub     = Astore->rowind;
    xa_begin = Astore->colbeg;
    xa_end   = Astore->colend;

    /* Allocate storage common to the factor routines */
    *info = sLUMemInit(fact, work, lwork, m, n, Astore->nnz,
                       panel_size, fill_ratio, L, U, Glu, &iwork, &swork);
    if ( *info ) return;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    xlsub   = Glu->xlsub;
    xlusup  = Glu->xlusup;
    xusub   = Glu->xusub;
    
    SetIWork(m, n, panel_size, iwork, &segrep, &parent, &xplore,
	     &repfnz, &panel_lsub, &xprune, &marker);
    sSetRWork(m, panel_size, swork, &dense, &tempv);
    
    usepr = (fact == SamePattern_SameRowPerm);
    if ( usepr ) {
	/* Compute the inverse of perm_r */
	iperm_r = (int *) int32Malloc(m);
	for (k = 0; k < m; ++k) iperm_r[perm_r[k]] = k;
	iperm_r_allocated = 1;
    }
    iperm_c = (int *) int32Malloc(n);
    for (k = 0; k < n; ++k) iperm_c[perm_c[k]] = k;

    /* Identify relaxed snodes */
    relax_end = (int *) intMalloc(n);
    if ( options->SymmetricMode == YES ) {
        heap_relax_snode(n, etree, relax, marker, relax_end); 
    } else {
        relax_snode(n, etree, relax, marker, relax_end); 
    }
    
    ifill (perm_r, m, SLU_EMPTY);
    ifill (marker, m * NO_MARKER, SLU_EMPTY);
    supno[0] = -1;
    xsup[0]  = xlsub[0] = xusub[0] = xlusup[0] = 0;
    w_def    = panel_size;

    /* 
     * Work on one "panel" at a time. A panel is one of the following: 
     *	   (a) a relaxed supernode at the bottom of the etree, or
     *	   (b) panel_size contiguous columns, defined by the user
     */
    for (jcol = 0; jcol < min_mn; ) {

	if ( relax_end[jcol] != SLU_EMPTY ) { /* start of a relaxed snode */
   	    kcol = relax_end[jcol];	  /* end of the relaxed snode */
	    panel_histo[kcol-jcol+1]++;

	    /* --------------------------------------
	     * Factorize the relaxed supernode(jcol:kcol) 
	     * -------------------------------------- */
	    /* Determine the union of the row structure of the snode */
	    if ( (*info = ssnode_dfs(jcol, kcol, asub, xa_begin, xa_end,
				    xprune, marker, Glu)) != 0 )
		return;

            nextu    = xusub[jcol];
	    nextlu   = xlusup[jcol];
	    jsupno   = supno[jcol];
	    fsupc    = xsup[jsupno];
	    new_next = nextlu + (xlsub[fsupc+1]-xlsub[fsupc])*(kcol-jcol+1);
	    nzlumax = Glu->nzlumax;
	    while ( new_next > nzlumax ) {
		if ( (*info = sLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu)) )
		    return;
	    }
    
	    for (icol = jcol; icol<= kcol; icol++) {
		xusub[icol+1] = nextu;
		
    		/* Scatter into SPA dense[*] */
    		for (k = xa_begin[icol]; k < xa_end[icol]; k++)
        	    dense[asub[k]] = a[k];

	       	/* Numeric update within the snode */
	        ssnode_bmod(icol, jsupno, fsupc, dense, tempv, Glu, stat);

		if ( (*info = spivotL(icol, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;
		
#if ( DEBUGlevel>=2 )
		sprint_lu_col("[1]: ", icol, pivrow, xprune, Glu);
#endif

	    }

	    jcol = icol;

	} else { /* Work on one panel of panel_size columns */
	    
	    /* Adjust panel_size so that a panel won't overlap with the next 
	     * relaxed snode.
	     */
	    panel_size = w_def;
	    for (k = jcol + 1; k < SUPERLU_MIN(jcol+panel_size, min_mn); k++) 
		if ( relax_end[k] != SLU_EMPTY ) {
		    panel_size = k - jcol;
		    break;
		}
	    if ( k == min_mn ) panel_size = min_mn - jcol;
	    panel_histo[panel_size]++;

	    /* symbolic factor on a panel of columns */
	    spanel_dfs(m, panel_size, jcol, A, perm_r, &nseg1,
		      dense, panel_lsub, segrep, repfnz, xprune,
		      marker, parent, xplore, Glu);
	    
	    /* numeric sup-panel updates in topological order */
	    spanel_bmod(m, panel_size, jcol, nseg1, dense,
		        tempv, segrep, repfnz, Glu, stat);
	    
	    /* Sparse LU within the panel, and below panel diagonal */
    	    for ( jj = jcol; jj < jcol + panel_size; jj++) {
 		k = (jj - jcol) * m; /* column index for w-wide arrays */

		nseg = nseg1;	/* Begin after all the panel segments */

	    	if ((*info = scolumn_dfs(m, jj, perm_r, &nseg, &panel_lsub[k],
					segrep, &repfnz[k], xprune, marker,
					parent, xplore, Glu)) != 0) return;

	      	/* Numeric updates */
	    	if ((*info = scolumn_bmod(jj, (nseg - nseg1), &dense[k],
					 tempv, &segrep[nseg1], &repfnz[k],
					 jcol, Glu, stat)) != 0) return;
		
	        /* Copy the U-segments to ucol[*] */
		if ((*info = scopy_to_ucol(jj, nseg, segrep, &repfnz[k],
					  perm_r, &dense[k], Glu)) != 0)
		    return;

	    	if ( (*info = spivotL(jj, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;

		/* Prune columns (0:jj-1) using column jj */
	    	spruneL(jj, perm_r, pivrow, nseg, segrep,
                        &repfnz[k], xprune, Glu);

		/* Reset repfnz[] for this column */
	    	resetrep_col (nseg, segrep, &repfnz[k]);
		
#if ( DEBUGlevel>=2 )
		sprint_lu_col("[2]: ", jj, pivrow, xprune, Glu);
#endif

	    }

   	    jcol += panel_size;	/* Move to the next panel */

	} /* else */

    } /* for */

    *info = iinfo;

    /* Complete perm_r[] for rank-deficient or tall-skinny matrices */
    /* k is the rank of U
       pivots have been completed for rows < k
       Now fill in the pivots for rows k to m */
    k = iinfo == 0 ? n : (int)iinfo - 1;
    if (m > k) {
        /* if k == m, then all the row permutations are complete and
           we can short circuit looking through the rest of the vector */
        for (i = 0; i < m && k < m; ++i) {
            if (perm_r[i] == SLU_EMPTY) {
                perm_r[i] = k;
                ++k;
            }

        }
    }
    
    countnz(min_mn, xprune, &nnzL, &nnzU, Glu);
    fixupL(min_mn, perm_r, Glu);

    sLUWorkFree(iwork, swork, Glu); /* Free work space and compress storage */
    SUPERLU_FREE(xplore);
    SUPERLU_FREE(xprune);

    if ( fact == SamePattern_SameRowPerm ) {
        /* L and U structures may have changed due to possibly different
	   pivoting, even though the storage is available.
	   There could also be memory expansions, so the array locations
           may have changed, */
        ((SCformat *)L->Store)->nnz = nnzL;
	((SCformat *)L->Store)->nsuper = Glu->supno[n];
	((SCformat *)L->Store)->nzval = (float *) Glu->lusup;
	((SCformat *)L->Store)->nzval_colptr = Glu->xlusup;
	((SCformat *)L->Store)->rowind = Glu->lsub;
	((SCformat *)L->Store)->rowind_colptr = Glu->xlsub;
	((NCformat *)U->Store)->nnz = nnzU;
	((NCformat *)U->Store)->nzval = (float *) Glu->ucol;
	((NCformat *)U->Store)->rowind = Glu->usub;
	((NCformat *)U->Store)->colptr = Glu->xusub;
    } else {
        sCreate_SuperNode_Matrix(L, A->nrow, min_mn, nnzL, 
	      (float *) Glu->lusup, Glu->xlusup, 
              Glu->lsub, Glu->xlsub, Glu->supno, Glu->xsup,
              SLU_SC, SLU_S, SLU_TRLU);
    	sCreate_CompCol_Matrix(U, min_mn, min_mn, nnzU, 
	      (float *) Glu->ucol, Glu->usub, Glu->xusub,
              SLU_NC, SLU_S, SLU_TRU);
    }
    
    ops[FACT] += ops[TRSV] + ops[GEMV];	
    stat->expansions = --(Glu->num_expansions);
    
    if ( iperm_r_allocated ) SUPERLU_FREE (iperm_r);
    SUPERLU_FREE (iperm_c);
    SUPERLU_FREE (relax_end);

}